

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 CalcWindowAutoFitSize(ImGuiWindow *window,ImVec2 *size_contents)

{
  ImVec2 mx;
  ImGuiViewport *pIVar1;
  float *in_RSI;
  long in_RDI;
  bool bVar2;
  bool bVar3;
  float fVar4;
  ImVec2 IVar5;
  bool will_have_scrollbar_y;
  bool will_have_scrollbar_x;
  ImVec2 size_auto_fit_after_constraint;
  ImVec2 avail_size;
  ImVec2 size_min;
  bool is_menu;
  bool is_popup;
  ImVec2 size_desired;
  ImVec2 size_pad;
  float decoration_up_height;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImVec2 size_auto_fit;
  ImVec2 *in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  ImVec2 *in_stack_ffffffffffffff48;
  ImVec2 *lhs;
  ImGuiWindow *in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff58;
  float local_90;
  float fStack_8c;
  ImGuiWindow *in_stack_ffffffffffffff98;
  ImVec2 local_58;
  undefined1 local_4e;
  undefined1 local_4d;
  ImVec2 local_44;
  ImVec2 local_3c;
  float local_34;
  float fStack_30;
  float local_2c;
  ImVec2 local_28;
  ImGuiContext *local_20;
  float *local_18;
  long local_10;
  ImVec2 local_8;
  
  local_20 = GImGui;
  local_28 = (ImVec2)&GImGui->Style;
  local_18 = in_RSI;
  local_10 = in_RDI;
  fVar4 = ImGuiWindow::TitleBarHeight(in_stack_ffffffffffffff50);
  local_2c = ImGuiWindow::MenuBarHeight(in_stack_ffffffffffffff50);
  local_2c = fVar4 + local_2c;
  _local_34 = operator*(in_stack_ffffffffffffff38,0.0);
  local_44 = operator+(in_stack_ffffffffffffff38,(ImVec2 *)0x125379);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffb4,0.0,local_2c);
  local_3c = operator+(in_stack_ffffffffffffff38,(ImVec2 *)0x1253af);
  local_8 = local_3c;
  if ((*(uint *)(local_10 + 0xc) & 0x2000000) == 0) {
    local_4d = (*(uint *)(local_10 + 0xc) & 0x4000000) != 0;
    local_4e = (*(uint *)(local_10 + 0xc) & 0x10000000) != 0;
    local_58 = *(ImVec2 *)((long)local_28 + 0x18);
    if (((bool)local_4d) || ((bool)local_4e)) {
      in_stack_ffffffffffffff50 = (ImGuiWindow *)&stack0xffffffffffffff98;
      ImVec2::ImVec2((ImVec2 *)in_stack_ffffffffffffff50,4.0,4.0);
      local_58 = ImMin(in_stack_ffffffffffffff48,
                       (ImVec2 *)
                       CONCAT17(in_stack_ffffffffffffff47,
                                CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)));
    }
    pIVar1 = ImGui::GetMainViewport();
    IVar5 = pIVar1->Size;
    operator*(in_stack_ffffffffffffff38,0.0);
    operator-(in_stack_ffffffffffffff38,(ImVec2 *)0x1254b1);
    lhs = &stack0xffffffffffffffa8;
    ImMax(lhs,(ImVec2 *)
              CONCAT17(in_stack_ffffffffffffff47,
                       CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)));
    mx.y = fVar4;
    mx.x = in_stack_ffffffffffffff58;
    local_8 = ImClamp((ImVec2 *)in_stack_ffffffffffffff50,lhs,mx);
    IVar5 = CalcWindowSizeAfterConstraint(in_stack_ffffffffffffff98,(ImVec2 *)IVar5);
    local_90 = IVar5.x;
    if (((*local_18 <= (local_90 - local_34) - 0.0) || ((*(uint *)(local_10 + 0xc) & 8) != 0)) ||
       (bVar2 = true, (*(uint *)(local_10 + 0xc) & 0x800) == 0)) {
      bVar2 = (*(uint *)(local_10 + 0xc) & 0x8000) != 0;
    }
    fStack_8c = IVar5.y;
    if ((local_18[1] <= (fStack_8c - fStack_30) - local_2c) ||
       (bVar3 = true, (*(uint *)(local_10 + 0xc) & 8) != 0)) {
      bVar3 = (*(uint *)(local_10 + 0xc) & 0x4000) != 0;
    }
    if (bVar2) {
      local_8.y = *(float *)((long)local_28 + 0x74) + local_8.y;
    }
    if (bVar3) {
      local_8.x = *(float *)((long)local_28 + 0x74) + local_8.x;
    }
  }
  return local_8;
}

Assistant:

static ImVec2 CalcWindowAutoFitSize(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    const float decoration_up_height = window->TitleBarHeight() + window->MenuBarHeight();
    ImVec2 size_pad = window->WindowPadding * 2.0f;
    ImVec2 size_desired = size_contents + size_pad + ImVec2(0.0f, decoration_up_height);
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_desired;
    }
    else
    {
        // Maximum window size is determined by the viewport size or monitor size
        const bool is_popup = (window->Flags & ImGuiWindowFlags_Popup) != 0;
        const bool is_menu = (window->Flags & ImGuiWindowFlags_ChildMenu) != 0;
        ImVec2 size_min = style.WindowMinSize;
        if (is_popup || is_menu) // Popups and menus bypass style.WindowMinSize by default, but we give then a non-zero minimum size to facilitate understanding problematic cases (e.g. empty popups)
            size_min = ImMin(size_min, ImVec2(4.0f, 4.0f));

        // FIXME-VIEWPORT-WORKAREA: May want to use GetWorkSize() instead of Size depending on the type of windows?
        ImVec2 avail_size = ImGui::GetMainViewport()->Size;
        ImVec2 size_auto_fit = ImClamp(size_desired, size_min, ImMax(size_min, avail_size - style.DisplaySafeAreaPadding * 2.0f));

        // When the window cannot fit all contents (either because of constraints, either because screen is too small),
        // we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than ViewportSize-WindowPadding.
        ImVec2 size_auto_fit_after_constraint = CalcWindowSizeAfterConstraint(window, size_auto_fit);
        bool will_have_scrollbar_x = (size_auto_fit_after_constraint.x - size_pad.x - 0.0f                 < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysHorizontalScrollbar);
        bool will_have_scrollbar_y = (size_auto_fit_after_constraint.y - size_pad.y - decoration_up_height < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysVerticalScrollbar);
        if (will_have_scrollbar_x)
            size_auto_fit.y += style.ScrollbarSize;
        if (will_have_scrollbar_y)
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}